

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

double __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::ExpFunc::precision
          (ExpFunc *this,EvalContext *ctx,double ret,double x)

{
  Precision PVar1;
  ulong uVar2;
  double dVar3;
  
  PVar1 = ctx->floatPrecision;
  if (PVar1 == PRECISION_LOWP) {
    dVar3 = 2.0;
  }
  else if (PVar1 == PRECISION_MEDIUMP) {
    uVar2 = -(ulong)(-x <= x);
    dVar3 = (double)(~uVar2 & (ulong)-x | (ulong)x & uVar2);
    dVar3 = dVar3 + dVar3 + 2.0;
  }
  else {
    if (PVar1 != PRECISION_HIGHP) {
      return 0.0;
    }
    uVar2 = -(ulong)(-x <= x);
    dVar3 = (double)(~uVar2 & (ulong)-x | (ulong)x & uVar2);
    dVar3 = dVar3 + dVar3 + 3.0;
  }
  dVar3 = tcu::FloatFormat::ulp(&ctx->format,ret,dVar3);
  return dVar3;
}

Assistant:

double		precision	(const EvalContext& ctx, double ret, double x) const
	{
		switch (ctx.floatPrecision)
		{
			case glu::PRECISION_HIGHP:
				return ctx.format.ulp(ret, 3.0 + 2.0 * deAbs(x));
			case glu::PRECISION_MEDIUMP:
				return ctx.format.ulp(ret, 2.0 + 2.0 * deAbs(x));
			case glu::PRECISION_LOWP:
				return ctx.format.ulp(ret, 2.0);
			default:
				DE_FATAL("Impossible");
		}
		return 0;
	}